

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkBddDec(Abc_Ntk_t *pNtk,int fVerbose)

{
  DdManager *dd;
  ulong uVar1;
  Abc_Obj_t *pAVar2;
  int *piVar3;
  void *__ptr;
  undefined8 uVar4;
  reo_man *p;
  DdNode *pDVar5;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  ulong uVar8;
  DdNode **pbVars;
  int iVar9;
  int iVar10;
  char *format;
  reo_man *pReo;
  long lVar11;
  long lVar12;
  DdNode *pFuncs [256];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f3,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  if (0x100 < pNtk->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f4,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  format = (char *)0xf4240;
  pAVar6 = pNtk;
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,1000000,0,1,fVerbose);
  if (dd == (DdManager *)0x0) {
    Abc_Print((int)pAVar6,format);
    pAVar6 = (Abc_Ntk_t *)0x0;
  }
  else {
    for (lVar12 = 0; uVar1 = (ulong)pNtk->vCos->nSize, lVar12 < (long)uVar1; lVar12 = lVar12 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,(int)lVar12);
      piVar3 = (int *)Vec_PtrEntry(pAVar2->pNtk->vAttrs,7);
      __ptr = *(void **)(piVar3 + 2);
      if (__ptr == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar10 = pAVar2->Id;
      lVar11 = (long)iVar10;
      iVar7 = *piVar3;
      if (iVar7 <= iVar10) {
        iVar9 = iVar10 + 10;
        if (iVar10 < iVar7 * 2) {
          iVar9 = iVar7 * 2;
        }
        if (iVar7 < iVar9) {
          __ptr = realloc(__ptr,(long)iVar9 * 8);
          *(void **)(piVar3 + 2) = __ptr;
          memset((void *)((long)*piVar3 * 8 + (long)__ptr),0,((long)iVar9 - (long)*piVar3) * 8);
          *piVar3 = iVar9;
        }
      }
      pDVar5 = *(DdNode **)((long)__ptr + lVar11 * 8);
      if (pDVar5 == (DdNode *)0x0) {
        if (*(code **)(piVar3 + 8) == (code *)0x0) {
          pDVar5 = (DdNode *)0x0;
        }
        else {
          uVar4 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
          *(undefined8 *)(*(long *)(piVar3 + 2) + lVar11 * 8) = uVar4;
          pDVar5 = *(DdNode **)(*(long *)(piVar3 + 2) + lVar11 * 8);
        }
      }
      pFuncs[lVar12] = pDVar5;
    }
    uVar8 = (ulong)(uint)dd->size;
    if (dd->size != pNtk->vCis->nSize) {
      __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                    ,0x400,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
    }
    for (iVar10 = 0; iVar7 = (int)uVar8, iVar10 < (int)uVar1; iVar10 = iVar10 + 1) {
      Cudd_addNewVarAtLevel(dd,dd->size);
      uVar1 = (ulong)(uint)pNtk->vCos->nSize;
    }
    p = Extra_ReorderInit(pNtk->vCis->nSize,1000);
    Extra_ReorderSetMinimizationType(p,REO_MINIMIZE_WIDTH);
    Extra_ReorderSetVerification(p,1);
    pReo = p;
    Extra_ReorderSetVerbosity(p,1);
    pDVar5 = Abc_NtkBddDecInt(pReo,dd,pFuncs,iVar7,pNtk->vCos->nSize);
    Cudd_Ref(pDVar5);
    Extra_ReorderQuit(p);
    Abc_NtkExploreCofs(dd,pDVar5,pbVars,pNtk->vCis->nSize,6);
    pAVar6 = Abc_NtkDup(pNtk);
    Cudd_RecursiveDeref(dd,pDVar5);
    Abc_NtkFreeGlobalBdds(pNtk,1);
  }
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddDec( Abc_Ntk_t * pNtk, int fVerbose )
{
    int nBddSizeMax   = 1000000;
    int fDropInternal =       0;
    int fReorder      =       1;
    Abc_Ntk_t * pNtkNew;
    reo_man * pReo;
    DdManager * dd;
    DdNode * pFuncs[BDD_FUNC_MAX];
    DdNode * bFunc;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddSizeMax, fDropInternal, fReorder, fVerbose );
    if ( dd == NULL )
    {
        Abc_Print( -1, "Construction of global BDDs has failed.\n" );
        return NULL;
    }
    // collect global BDDs
    Abc_NtkForEachCo( pNtk, pNode, i )
        pFuncs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // create new variables at the bottom
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
        Cudd_addNewVarAtLevel( dd, dd->size );

    // prepare reordering engine
    pReo = Extra_ReorderInit( Abc_NtkCiNum(pNtk), 1000 );
    Extra_ReorderSetMinimizationType( pReo, REO_MINIMIZE_WIDTH );
    Extra_ReorderSetVerification( pReo, 1 );
    Extra_ReorderSetVerbosity( pReo, 1 );

    // derive characteristic function
    bFunc = Abc_NtkBddDecInt( pReo, dd, pFuncs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk) );  Cudd_Ref( bFunc );
    Extra_ReorderQuit( pReo );

Abc_NtkExploreCofs( dd, bFunc, dd->vars, Abc_NtkCiNum(pNtk), 6 );

    // create new network
//    pNtkNew = Abc_NtkCreateFromCharFunc( pNtk, dd, bFunc );
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Cudd_RecursiveDeref( dd, bFunc );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    return pNtkNew;
}